

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O1

reloc_entry_t * read_reloc_entry(void)

{
  int iVar1;
  reloc_entry_t *prVar2;
  
  prVar2 = (reloc_entry_t *)mmalloc(0x10);
  iVar1 = read_int32();
  prVar2->sym_id = iVar1;
  iVar1 = read_int32();
  prVar2->section_id = iVar1;
  iVar1 = read_int16();
  prVar2->offset = iVar1;
  iVar1 = read_int32();
  prVar2->flags = iVar1;
  return prVar2;
}

Assistant:

reloc_entry_t* read_reloc_entry()
{
    reloc_entry_t* reloc = (reloc_entry_t*)mmalloc(sizeof(reloc_entry_t));
    reloc->sym_id = read_int32();
    reloc->section_id = read_int32();
    reloc->offset = read_int16();
    reloc->flags = read_int32();
    return reloc;
}